

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::input_read(Graph *this,string *name)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  int idLoadFactor;
  int *piVar5;
  ulong uVar6;
  int n_edges;
  int num_nos;
  int destinyId;
  int originId;
  double resistance;
  string aux;
  double reactance;
  int vertexId;
  double voltage;
  ifstream input;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  double local_298;
  undefined1 *local_290;
  undefined8 local_288;
  undefined1 local_280;
  undefined7 uStack_27f;
  double local_270;
  double local_268;
  int local_25c;
  string *local_258;
  double local_250;
  double *local_248;
  double local_240;
  string local_238 [520];
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::ifstream::ifstream(local_238);
  local_258 = name;
  std::ifstream::open(local_238,(_Ios_Openmode)name);
  local_290 = &local_280;
  local_288 = 0;
  local_280 = 0;
  while( true ) {
    iVar1 = std::__cxx11::string::compare((char *)&local_290);
    if (iVar1 == 0) break;
    std::operator>>((istream *)local_238,(string *)&local_290);
  }
  std::operator>>((istream *)local_238,(string *)&local_290);
  std::istream::_M_extract<double>((double *)local_238);
  std::operator>>((istream *)local_238,(string *)&local_290);
  std::operator>>((istream *)local_238,(string *)&local_290);
  std::istream::_M_extract<double>((double *)local_238);
  std::operator>>((istream *)local_238,(string *)&local_290);
  std::operator>>((istream *)local_238,(string *)&local_290);
  local_248 = &this->ZB;
  std::istream::_M_extract<double>((double *)local_238);
  std::ifstream::close();
  std::ifstream::open(local_238,(_Ios_Openmode)local_258);
  do {
    std::operator>>((istream *)local_238,(string *)&local_290);
    iVar1 = std::__cxx11::string::compare((char *)&local_290);
  } while (iVar1 != 0);
  std::istream::operator>>((istream *)local_238,&local_2a4);
  if (0 < local_2a4) {
    uVar6 = 1;
    iVar1 = 0;
    do {
      iVar2 = (iVar1 - ((int)(uVar6 / 0xd) + (int)(uVar6 / 0xd) * 0xc)) + 1;
      if (iVar2 < 10) {
        if (iVar2 == 1) {
          std::istream::operator>>((istream *)local_238,&local_25c);
        }
        else if (iVar2 == 4) {
          std::istream::_M_extract<double>((double *)local_238);
        }
        else {
LAB_00103029:
          std::operator>>((istream *)local_238,(string *)&local_290);
        }
      }
      else if (iVar2 == 10) {
        std::istream::_M_extract<double>((double *)local_238);
        local_268 = (local_268 / this->PB) * this->mw_factor;
      }
      else {
        if (iVar2 != 0xb) goto LAB_00103029;
        std::istream::_M_extract<double>((double *)local_238);
        local_250 = (local_250 / this->PB) * this->mw_factor;
        insertVertex(this,local_25c,local_268,local_250,local_240,idLoadFactor);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      iVar1 = iVar1 + 1;
    } while (SBORROW4(iVar1,local_2a4 * 0xd) != iVar1 + local_2a4 * -0xd < 0);
  }
  do {
    std::operator>>((istream *)local_238,(string *)&local_290);
    iVar1 = std::__cxx11::string::compare((char *)&local_290);
  } while (iVar1 != 0);
  std::istream::operator>>((istream *)local_238,&local_2a8);
  if (0 < local_2a8) {
    uVar6 = 1;
    iVar1 = 0;
    iVar2 = 0;
    do {
      uVar3 = iVar1 + (int)(uVar6 / 0xc) * -0xc;
      if (uVar3 < 4) {
        piVar5 = &local_2a0;
        switch(uVar3) {
        case 0:
          piVar5 = &local_29c;
        case 1:
          std::istream::operator>>((istream *)local_238,piVar5);
          break;
        case 2:
          std::istream::_M_extract<double>((double *)local_238);
          local_298 = local_298 / *local_248;
          break;
        case 3:
          std::istream::_M_extract<double>((double *)local_238);
          local_270 = local_270 / this->ZB;
          iVar2 = iVar2 + 1;
          insertEdge(this,local_29c,local_2a0,iVar2,local_298,local_270,false);
          insertEdge(this,local_2a0,local_29c,iVar2,local_298,local_270,false);
        }
      }
      else {
        std::operator>>((istream *)local_238,(string *)&local_290);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      iVar1 = iVar1 + 1;
    } while (SBORROW4(iVar1,local_2a8 * 0xc) != iVar1 + local_2a8 * -0xc < 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(local_258->_M_dataplus)._M_p,
                      local_258->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," lida!",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_290 != &local_280) {
    operator_delete(local_290,CONCAT71(uStack_27f,local_280) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Graph::input_read( string name ){

    cout << name << endl;
    int edgeId = 0;
    double power, resistance, reactance, reactive_power, voltage;

    ifstream input;
    input.open(name);

    string aux;

    int n_col_v = 13, n_col_e = 12; //numero de colunas do arquivo de entradaz
    while(aux != "Vb") input >> aux;

    input >> aux;
    input >> VB;
    input >> aux;input >> aux;
    input >> PB;
    input >> aux;input >> aux;
    input >> ZB;

    input.close();
    input.open(name);
    int vertexId, originId, destinyId;

    do{
        input >> aux;
    }while(aux != "num_nos");///pula lixo ate chegar na parte de informacoes do no

    int num_nos;
    input >> num_nos;
    for(int i=1 ; i<=num_nos*n_col_v; i++){
        if(i % n_col_v == 1){
            input >> vertexId;
        }
        else if(i % n_col_v == 4){
            input >> voltage;
        }
        else if(i % n_col_v == 10){
            input >> power;
            power /= PB;
            power *= mw_factor;
        }
        else if(i % n_col_v == 11){
            input >> reactive_power;
            reactive_power /=PB;
            reactive_power *= mw_factor;
            insertVertex(vertexId, power, reactive_power, voltage);
        }
        else
            input >> aux;
    }

    do{
        input >> aux;
    }while(aux != "num_arestas");

    int n_edges;
    input >> n_edges;

    for(int i=1 ; i<=n_edges*n_col_e; i++){
        if(i % n_col_e == 1){
            input >> originId;
        }
        else if(i % n_col_e == 2){
            input >> destinyId;
        }
        else if(i % n_col_e == 3){
            input >> resistance;
            resistance /= ZB;
        }
        else if(i % n_col_e == 4){
            input >> reactance;
            reactance /= ZB;

            edgeId++;
            insertEdge(originId, destinyId, edgeId, resistance, reactance, false);
            insertEdge(destinyId, originId, edgeId, resistance, reactance, false);
        }
        else
            input >> aux;
    }
    cout << "\n" << name << " lida!" << endl;
}